

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool flatbuffers::anon_unknown_0::compareName<flatbuffers::EnumDef>(EnumDef *a,EnumDef *b)

{
  uint uVar1;
  size_type __n;
  ulong uVar2;
  string local_60;
  string local_40;
  
  Namespace::GetFullyQualifiedName
            (&local_60,(a->super_Definition).defined_namespace,(string *)a,1000);
  Namespace::GetFullyQualifiedName
            (&local_40,(b->super_Definition).defined_namespace,(string *)b,1000);
  __n = local_60._M_string_length;
  if (local_40._M_string_length < local_60._M_string_length) {
    __n = local_40._M_string_length;
  }
  if (__n != 0) {
    uVar1 = memcmp(local_60._M_dataplus._M_p,local_40._M_dataplus._M_p,__n);
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_001296fe;
  }
  uVar2 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_60._M_string_length - local_40._M_string_length)) {
    uVar2 = local_60._M_string_length - local_40._M_string_length;
  }
  if (0x7ffffffe < (long)uVar2) {
    uVar2 = 0;
  }
LAB_001296fe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (bool)((byte)(uVar2 >> 0x1f) & 1);
}

Assistant:

static bool compareName(const T *a, const T *b) {
  return a->defined_namespace->GetFullyQualifiedName(a->name) <
         b->defined_namespace->GetFullyQualifiedName(b->name);
}